

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libeconf.c
# Opt level: O3

econf_err econf_getKeys(econf_file *kf,char *grp,size_t *length,char ***keys)

{
  size_t __nmemb;
  int iVar1;
  char *pcVar2;
  char *__ptr;
  char **ppcVar3;
  size_t sVar4;
  econf_err eVar5;
  size_t j;
  file_entry *pfVar6;
  long lVar7;
  long lVar8;
  size_t i;
  size_t sVar9;
  
  if (length != (size_t *)0x0) {
    *length = 0;
  }
  if (kf == (econf_file *)0x0) {
    return ECONF_ERROR;
  }
  if ((grp == (char *)0x0) || (*grp == '\0')) {
    grp = "_none_";
  }
  pcVar2 = strdup(grp);
  if (pcVar2 == (char *)0x0) {
    return ECONF_NOMEM;
  }
  __nmemb = kf->length;
  __ptr = (char *)calloc(__nmemb,1);
  if (__ptr == (char *)0x0) {
LAB_001038af:
    eVar5 = ECONF_NOMEM;
    free(pcVar2);
  }
  else {
    if (__nmemb == 0) {
      free(pcVar2);
    }
    else {
      pfVar6 = kf->file_entry;
      sVar9 = 0;
      sVar4 = 0;
      do {
        iVar1 = strcmp(pfVar6->group,pcVar2);
        if (iVar1 == 0) {
          __ptr[sVar9] = '\x01';
          sVar4 = sVar4 + 1;
        }
        sVar9 = sVar9 + 1;
        pfVar6 = pfVar6 + 1;
      } while (__nmemb != sVar9);
      free(pcVar2);
      if (sVar4 != 0) {
        lVar8 = 8;
        ppcVar3 = (char **)calloc(sVar4 + 1,8);
        *keys = ppcVar3;
        pcVar2 = __ptr;
        if (ppcVar3 != (char **)0x0) {
          lVar7 = 0;
          sVar9 = 0;
          do {
            if (__ptr[sVar9] == '\x01') {
              pcVar2 = strdup(*(char **)((long)&kf->file_entry->group + lVar8));
              (*keys)[lVar7] = pcVar2;
              lVar7 = lVar7 + 1;
            }
            sVar9 = sVar9 + 1;
            lVar8 = lVar8 + 0x38;
          } while (__nmemb != sVar9);
          if (length != (size_t *)0x0) {
            *length = sVar4;
          }
          free(__ptr);
          return ECONF_SUCCESS;
        }
        goto LAB_001038af;
      }
    }
    free(__ptr);
    eVar5 = ECONF_NOKEY;
  }
  return eVar5;
}

Assistant:

econf_err
econf_getKeys(econf_file *kf, const char *grp, size_t *length, char ***keys)
{
  if (length != NULL)
    *length = 0; /* initialize */
  if (!kf)
    return ECONF_ERROR;

  size_t tmp = 0;
  char *group = (!grp || !*grp) ? strdup(KEY_FILE_NULL_VALUE) : strdup(grp);
  if (group == NULL)
    return ECONF_NOMEM;

  bool *uniques = calloc(kf->length, sizeof(bool));
  if (uniques == NULL)
    {
      free(group);
      return ECONF_NOMEM;
    }
  for (size_t i = 0; i < kf->length; i++) {
    if (!strcmp(kf->file_entry[i].group, group)) {
      uniques[i] = 1;
      tmp++;
    }
  }
  free(group);
  if (!tmp)
    {
      free (uniques);
      return ECONF_NOKEY;
    }
  *keys = calloc(tmp + 1, sizeof(char*));
  if (*keys == NULL) {
    free (uniques);
    return ECONF_NOMEM;
  }

  for (size_t i = 0, j = 0; i < kf->length; i++)
    if (uniques[i])
      (*keys)[j++] = strdup(kf->file_entry[i].key);

  if (length != NULL)
    *length = tmp;

  free(uniques);
  return ECONF_SUCCESS;
}